

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<const_void_*,_(anonymous_namespace)::Data> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::insert
          (Bucket *this)

{
  byte bVar1;
  long in_RSI;
  
  bVar1 = *(byte *)((long)&this[8].index + 1);
  if (bVar1 == (byte)this[8].index) {
    Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::addStorage
              ((Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *)this);
    bVar1 = *(byte *)((long)&this[8].index + 1);
  }
  *(uchar *)((long)&this[8].index + 1) = (this[8].span)->offsets[(ulong)bVar1 * 0x10];
  *(byte *)((long)&this->span + in_RSI) = bVar1;
  return (Node<const_void_*,_(anonymous_namespace)::Data> *)
         ((this[8].span)->offsets + (ulong)bVar1 * 0x10);
}

Assistant:

Node *insert() const
        {
            return span->insert(index);
        }